

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O3

void __thiscall tfnw::TransferFunctionWidget::update_gpu_image(TransferFunctionWidget *this)

{
  pointer puVar1;
  uint in_EAX;
  ulong uStack_18;
  GLint prev_tex_2d;
  
  uStack_18 = (ulong)in_EAX;
  (*_ptrc_glGetIntegerv)(0x8069,&prev_tex_2d);
  if (this->colormap_img == 0xffffffff) {
    (*_ptrc_glGenTextures)(1,&this->colormap_img);
    (*_ptrc_glBindTexture)(0xde1,this->colormap_img);
    (*_ptrc_glTexParameteri)(0xde1,0x2801,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2800,0x2601);
    (*_ptrc_glTexParameteri)(0xde1,0x2802,0x812f);
    (*_ptrc_glTexParameteri)(0xde1,0x2803,0x812f);
  }
  if (this->gpu_image_stale == true) {
    this->gpu_image_stale = false;
    (*_ptrc_glBindTexture)(0xde1,this->colormap_img);
    puVar1 = (this->current_colormap).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (*_ptrc_glTexImage2D)
              (0xde1,0,0x8051,
               (GLsizei)((ulong)((long)(this->current_colormap).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >>
                        2),1,0,0x1908,0x1401,puVar1);
  }
  (*_ptrc_glBindTexture)(0xde1,prev_tex_2d);
  return;
}

Assistant:

void TransferFunctionWidget::update_gpu_image()
{
    GLint prev_tex_2d = 0;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &prev_tex_2d);

    if (colormap_img == (GLuint)-1) {
        glGenTextures(1, &colormap_img);
        glBindTexture(GL_TEXTURE_2D, colormap_img);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    }
    if (gpu_image_stale) {
        gpu_image_stale = false;
        glBindTexture(GL_TEXTURE_2D, colormap_img);
        glTexImage2D(GL_TEXTURE_2D,
                     0,
                     GL_RGB8,
                     (GLsizei)(current_colormap.size() / 4),
                     1,
                     0,
                     GL_RGBA,
                     GL_UNSIGNED_BYTE,
                     current_colormap.data());
    }
    glBindTexture(GL_TEXTURE_2D, prev_tex_2d);
}